

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O2

void __thiscall Architecture::parseReadOnly(Architecture *this,Element *el)

{
  pointer ppEVar1;
  Range range;
  Range RStack_38;
  
  for (ppEVar1 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar1 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    Range::restoreXml(&RStack_38,*ppEVar1,&this->super_AddrSpaceManager);
    Database::setPropertyRange(this->symboltab,0x4000,&RStack_38);
  }
  return;
}

Assistant:

void Architecture::parseReadOnly(const Element *el)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  
  for(iter=list.begin();iter!=list.end();++iter) {
    Range range;
    range.restoreXml(*iter,this);
    symboltab->setPropertyRange(Varnode::readonly,range);
  }
}